

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O1

void lisp_Xvideocolor(int flag)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  XGCValues gcv;
  XEvent event;
  undefined8 local_158;
  undefined8 uStack_150;
  unsigned_long local_148;
  unsigned_long uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8 [8];
  Window local_b8;
  undefined8 local_b0;
  uint local_a8;
  uint local_a4;
  
  memset(local_d8,0,0xc0);
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  puVar2 = &foregroundPixel;
  if (flag != 0) {
    puVar2 = &backgroundPixel;
  }
  uVar1 = *puVar2;
  XGetGCValues(currentdsp->display_id,currentdsp->Copy_GC,0xc,&local_158);
  if (uVar1 != local_148) {
    uStack_140 = local_148;
    local_148 = uVar1;
    XChangeGC(currentdsp->display_id,currentdsp->Copy_GC,0xc);
    local_d8[0] = 0xc;
    local_b8 = currentdsp->DisplayWindow;
    local_b0 = 0;
    local_a8 = (currentdsp->Visible).width;
    local_a4 = (currentdsp->Visible).height;
    XSendEvent(currentdsp->display_id,local_b8,1,0);
  }
  XFlush(currentdsp->display_id);
  return;
}

Assistant:

void lisp_Xvideocolor(int flag)
{
  XEvent event = {0};
  XGCValues gcv = {0};
  unsigned long newForeground;

  XLOCK;
  newForeground = flag ? backgroundPixel : foregroundPixel;

  /* window -- are we making a change? */
  XGetGCValues(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
  if (newForeground != gcv.foreground) {
      /* swap foreground and background in the graphics context*/
      gcv.background = gcv.foreground;
      gcv.foreground = newForeground;
      XChangeGC(currentdsp->display_id, currentdsp->Copy_GC, GCForeground | GCBackground, &gcv);
      /* notify the display code to refresh the visible screen with new fg/bg colors */
      event.type = Expose;
      event.xexpose.window = currentdsp->DisplayWindow;
      event.xexpose.x = 0;
      event.xexpose.y = 0;
      event.xexpose.width = (int)currentdsp->Visible.width;
      event.xexpose.height = (int)currentdsp->Visible.height;
      XSendEvent(currentdsp->display_id, currentdsp->DisplayWindow, True, 0, &event);
  }

  XFlush(currentdsp->display_id);
  XUNLOCK(currentdsp);

}